

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void compute_sgrproj_err(uint8_t *dat8,int width,int height,int dat_stride,uint8_t *src8,
                        int src_stride,int use_highbitdepth,int bit_depth,int pu_width,int pu_height
                        ,int ep,int32_t *flt0,int32_t *flt1,int flt_stride,int *exqd,int64_t *err,
                        aom_internal_error_info *error_info)

{
  int64_t iVar1;
  undefined4 in_ECX;
  undefined8 unaff_RBX;
  undefined8 unaff_RBP;
  int in_ESI;
  uint8_t *in_RDI;
  undefined8 in_R8;
  int in_R9D;
  undefined8 unaff_R14;
  uint8_t *unaff_R15;
  int unaff_retaddr;
  undefined4 unaff_retaddr_00;
  undefined4 in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  undefined4 in_stack_0000001c;
  int in_stack_00000020;
  undefined4 in_stack_00000024;
  undefined4 in_stack_00000028;
  undefined4 in_stack_0000002c;
  int in_stack_00000030;
  undefined4 in_stack_00000034;
  int32_t *in_stack_00000038;
  sgr_params_type *params;
  int in_stack_00000048;
  int exq [2];
  int in_stack_00000060;
  int *in_stack_00000078;
  sgr_params_type *in_stack_00000080;
  undefined4 in_stack_ffffffffffffff6c;
  int *xq;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  int src_stride_00;
  
  src_stride_00 = (int)((ulong)unaff_RBX >> 0x20);
  apply_sgr(in_ESI,(uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffc8),(int)((ulong)in_R8 >> 0x20)
            ,(int)in_R8,in_R9D,in_stack_ffffffffffffffb8,(int)unaff_R15,(int)unaff_RBP,unaff_retaddr
            ,(int32_t *)CONCAT44(in_stack_0000000c,in_stack_00000008),
            (int32_t *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000018,
            (aom_internal_error_info *)CONCAT44(in_stack_00000024,in_stack_00000020));
  xq = (int *)CONCAT44(in_stack_00000034,in_stack_00000030);
  get_proj_subspace((uint8_t *)CONCAT44(in_stack_0000001c,in_stack_00000018),in_stack_00000014,
                    in_stack_00000010,in_stack_0000000c,
                    (uint8_t *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                    (int)((ulong)unaff_RBP >> 0x20),exq[1],(int32_t *)src8,in_stack_00000060,
                    (int32_t *)CONCAT44(width,height),(int)dat8,in_stack_00000078,in_stack_00000080)
  ;
  encode_xq(xq,(int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_00000008),
            (sgr_params_type *)0x2b3ab9);
  iVar1 = finer_search_pixel_proj_error
                    (unaff_R15,(int)((ulong)unaff_R14 >> 0x20),(int)unaff_R14,src_stride_00,in_RDI,
                     in_ESI,in_stack_00000020,
                     (int32_t *)CONCAT44(in_stack_0000002c,in_stack_00000028),in_stack_00000030,
                     in_stack_00000038,(int)params,in_stack_00000048,
                     (int *)CONCAT44(src_stride,exq[1]),(sgr_params_type *)src8);
  *(int64_t *)CONCAT44(src_stride,exq[1]) = iVar1;
  return;
}

Assistant:

static inline void compute_sgrproj_err(
    const uint8_t *dat8, const int width, const int height,
    const int dat_stride, const uint8_t *src8, const int src_stride,
    const int use_highbitdepth, const int bit_depth, const int pu_width,
    const int pu_height, const int ep, int32_t *flt0, int32_t *flt1,
    const int flt_stride, int *exqd, int64_t *err,
    struct aom_internal_error_info *error_info) {
  int exq[2];
  apply_sgr(ep, dat8, width, height, dat_stride, use_highbitdepth, bit_depth,
            pu_width, pu_height, flt0, flt1, flt_stride, error_info);
  const sgr_params_type *const params = &av1_sgr_params[ep];
  get_proj_subspace(src8, width, height, src_stride, dat8, dat_stride,
                    use_highbitdepth, flt0, flt_stride, flt1, flt_stride, exq,
                    params);
  encode_xq(exq, exqd, params);
  *err = finer_search_pixel_proj_error(
      src8, width, height, src_stride, dat8, dat_stride, use_highbitdepth, flt0,
      flt_stride, flt1, flt_stride, 2, exqd, params);
}